

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O3

Matrix3x3 * __thiscall
CGL::Matrix3x3::operator-(Matrix3x3 *__return_storage_ptr__,Matrix3x3 *this,Matrix3x3 *B)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Matrix3x3 *pMVar3;
  int i_1;
  long lVar4;
  double *pdVar5;
  int i;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  bool bVar10;
  undefined8 uVar11;
  long lVar9;
  
  pMVar3 = __return_storage_ptr__;
  __return_storage_ptr__->entries[2].x = 0.0;
  __return_storage_ptr__->entries[2].y = 0.0;
  __return_storage_ptr__->entries[1].y = 0.0;
  __return_storage_ptr__->entries[1].z = 0.0;
  __return_storage_ptr__->entries[0].z = 0.0;
  __return_storage_ptr__->entries[1].x = 0.0;
  __return_storage_ptr__->entries[0].x = 0.0;
  __return_storage_ptr__->entries[0].y = 0.0;
  __return_storage_ptr__->entries[2].z = 0.0;
  auVar2 = _DAT_001900d0;
  auVar1 = _DAT_001900c0;
  lVar4 = 0;
  lVar6 = 0;
  pdVar5 = (double *)__return_storage_ptr__;
  do {
    lVar7 = 0;
    auVar8 = auVar1;
    do {
      bVar10 = SUB164(auVar8 ^ auVar2,4) == -0x80000000 && SUB164(auVar8 ^ auVar2,0) < -0x7ffffffd;
      if (bVar10) {
        uVar11 = 0x3ff0000000000000;
        if (lVar4 != lVar7) {
          uVar11 = 0;
        }
        *(undefined8 *)((long)pdVar5 + lVar7) = uVar11;
      }
      if (bVar10) {
        uVar11 = 0x3ff0000000000000;
        if (lVar4 + -0x18 != lVar7) {
          uVar11 = 0;
        }
        *(undefined8 *)((long)pdVar5 + lVar7 + 0x18) = uVar11;
      }
      lVar9 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar9 + 2;
      lVar7 = lVar7 + 0x30;
    } while (lVar7 != 0x60);
    lVar6 = lVar6 + 1;
    lVar4 = lVar4 + 0x18;
    pdVar5 = pdVar5 + 1;
  } while (lVar6 != 3);
  lVar4 = 0;
  do {
    lVar6 = 0;
    do {
      *(double *)((long)__return_storage_ptr__ + lVar6) =
           *(double *)((long)this + lVar6) - *(double *)((long)B + lVar6);
      lVar6 = lVar6 + 0x18;
    } while (lVar6 != 0x48);
    lVar4 = lVar4 + 1;
    this = (Matrix3x3 *)((long)this + 8);
    B = (Matrix3x3 *)((long)B + 8);
    __return_storage_ptr__ = (Matrix3x3 *)((long)__return_storage_ptr__ + 8);
  } while (lVar4 != 3);
  return pMVar3;
}

Assistant:

Matrix3x3 Matrix3x3::operator-( const Matrix3x3& B ) const {
    const Matrix3x3& A( *this );
    Matrix3x3 C;

    for( int i = 0; i < 3; i++ )
    for( int j = 0; j < 3; j++ )
    {
       C(i,j) = A(i,j) - B(i,j);
    }

    return C;
  }